

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O0

void __thiscall MeCab::Dictionary::~Dictionary(Dictionary *this)

{
  void *in_RDI;
  Dictionary *unaff_retaddr;
  
  ~Dictionary(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Dictionary() { this->close(); }